

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RemoveNonJSOps.cpp
# Opt level: O2

void __thiscall
wasm::StubUnsupportedJSOpsPass::visitCallIndirect(StubUnsupportedJSOpsPass *this,CallIndirect *curr)

{
  ArenaVector<wasm::Expression_*> *pAVar1;
  Expression **ppEVar2;
  Block *value;
  ulong extraout_RDX;
  optional<wasm::Type> type;
  undefined1 auStack_78 [8];
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> items;
  undefined1 local_48 [8];
  Iterator __begin2;
  Builder builder;
  
  __begin2.index =
       (size_t)(this->
               super_WalkerPass<wasm::PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>_>
               ).
               super_PostWalker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
               .
               super_Walker<wasm::StubUnsupportedJSOpsPass,_wasm::Visitor<wasm::StubUnsupportedJSOpsPass,_void>_>
               .currModule;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auStack_78 = (undefined1  [8])0x0;
  items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  __begin2.parent = (ArenaVector<wasm::Expression_*> *)0x0;
  pAVar1 = (ArenaVector<wasm::Expression_*> *)
           (curr->operands).
           super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>.usedElements;
  local_48 = (undefined1  [8])&curr->operands;
  while ((__begin2.parent != pAVar1 || (local_48 != (undefined1  [8])&curr->operands))) {
    ppEVar2 = ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::Iterator::
              operator*((Iterator *)local_48);
    items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)Builder::makeDrop((Builder *)&__begin2.index,*ppEVar2);
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
               (Expression **)
               &items.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage);
    __begin2.parent =
         (ArenaVector<wasm::Expression_*> *)
         ((long)&((__begin2.parent)->
                 super_ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>).data +
         1);
  }
  local_48 = (undefined1  [8])Builder::makeDrop((Builder *)&__begin2.index,curr->target);
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)auStack_78,
             (Expression **)local_48);
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._8_8_ = 0;
  type.super__Optional_base<wasm::Type,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Type>._M_payload = (_Storage<wasm::Type,_true>)extraout_RDX;
  value = Builder::
          makeBlock<std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>,_true>
                    ((Builder *)&__begin2.index,
                     (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78,
                     type);
  stubOut(this,(Expression *)value,
          (Type)(curr->super_SpecificExpression<(wasm::Expression::Id)7>).super_Expression.type.id);
  std::_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~_Vector_base
            ((_Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *)auStack_78);
  return;
}

Assistant:

void visitCallIndirect(CallIndirect* curr) {
    // Indirect calls of the wrong type trap in wasm, but not in wasm2js. Remove
    // the indirect call, but leave the arguments.
    Builder builder(*getModule());
    std::vector<Expression*> items;
    for (auto* operand : curr->operands) {
      items.push_back(builder.makeDrop(operand));
    }
    items.push_back(builder.makeDrop(curr->target));
    stubOut(builder.makeBlock(items), curr->type);
  }